

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

void __thiscall despot::BaseRockSample::Init_5_5(BaseRockSample *this)

{
  pointer *ppCVar1;
  iterator __position;
  int *piVar2;
  long lVar3;
  Coord *this_00;
  int local_60;
  undefined4 uStack_5c;
  Coord local_58 [8];
  Coord local_50 [8];
  Coord local_48 [8];
  Coord local_40 [8];
  Coord local_38 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Using special layout for rocksample(5, 5)",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  this_00 = local_58;
  despot::Coord::Coord(this_00,2,4);
  despot::Coord::Coord(local_50,0,4);
  despot::Coord::Coord(local_48,3,3);
  despot::Coord::Coord(local_40,2,2);
  despot::Coord::Coord(local_38,4,1);
  despot::Coord::Coord((Coord *)&local_60,0,2);
  *(ulong *)&this->start_pos_ = CONCAT44(uStack_5c,local_60);
  local_60 = -1;
  Grid<int>::SetAllValues(&this->grid_,&local_60);
  if (0 < this->num_rocks_) {
    lVar3 = 0;
    do {
      piVar2 = Grid<int>::operator()(&this->grid_,this_00);
      *piVar2 = (int)lVar3;
      __position._M_current =
           (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<despot::Coord,std::allocator<despot::Coord>>::
        _M_realloc_insert<despot::Coord_const&>
                  ((vector<despot::Coord,std::allocator<despot::Coord>> *)&this->rock_pos_,
                   __position,this_00);
      }
      else {
        *(undefined8 *)__position._M_current = *(undefined8 *)this_00;
        ppCVar1 = &(this->rock_pos_).
                   super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 8;
      }
      lVar3 = lVar3 + 1;
      this_00 = this_00 + 8;
    } while (lVar3 < this->num_rocks_);
  }
  return;
}

Assistant:

void BaseRockSample::Init_5_5() {
	cout << "Using special layout for rocksample(5, 5)" << endl;

	Coord rocks[] = { Coord(2, 4), Coord(0, 4), Coord(3, 3), Coord(2, 2), Coord(
		4, 1) };

	start_pos_ = Coord(0, 2);
	grid_.SetAllValues(-1);
	for (int i = 0; i < num_rocks_; ++i) {
		grid_(rocks[i]) = i;
		rock_pos_.push_back(rocks[i]);
	}
}